

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O3

int mriStep_GetGammas(void *arkode_mem,realtype *gamma,realtype *gamrat,int **jcur,int *dgamma_fail)

{
  double dVar1;
  int iVar2;
  ARKodeMRIStepMem step_mem;
  ARKodeMem ark_mem;
  ARKodeMRIStepMem local_30;
  ARKodeMem local_28;
  
  iVar2 = mriStep_AccessStepMem(arkode_mem,"mriStep_GetGammas",&local_28,&local_30);
  if (iVar2 == 0) {
    *gamma = local_30->gamma;
    dVar1 = local_30->gamrat;
    *gamrat = dVar1;
    *jcur = &local_30->jcur;
    *dgamma_fail = (uint)(local_30->dgmax <= ABS(dVar1 + -1.0));
  }
  return iVar2;
}

Assistant:

int mriStep_GetGammas(void* arkode_mem, realtype *gamma,
                      realtype *gamrat, booleantype **jcur,
                      booleantype *dgamma_fail)
{
  ARKodeMem ark_mem;
  ARKodeMRIStepMem step_mem;
  int retval;

  /* access ARKodeMRIStepMem structure */
  retval = mriStep_AccessStepMem(arkode_mem, "mriStep_GetGammas",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  /* set outputs */
  *gamma  = step_mem->gamma;
  *gamrat = step_mem->gamrat;
  *jcur = &step_mem->jcur;
  *dgamma_fail = (SUNRabs(*gamrat - ONE) >= step_mem->dgmax);

  return(ARK_SUCCESS);
}